

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

mapped_type __thiscall ChebTools::MonomialCoefficients::get_coeffs(MonomialCoefficients *this,int n)

{
  bool bVar1;
  mapped_type *pmVar2;
  Index extraout_RDX;
  undefined4 in_register_00000034;
  unordered_map<int,_Eigen::Array<double,__1,_1,_0,__1,_1>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
  *this_00;
  mapped_type mVar3;
  undefined1 local_40 [44];
  int n_local;
  MonomialCoefficients *this_local;
  
  this_00 = (unordered_map<int,_Eigen::Array<double,__1,_1,_0,__1,_1>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
             *)CONCAT44(in_register_00000034,n);
  unique0x10000141 = this_00;
  this_local = this;
  local_40._24_8_ =
       std::
       unordered_map<int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>_>
       ::find(this_00,(key_type *)(local_40 + 0x24));
  local_40._16_8_ =
       std::
       unordered_map<int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>_>
       ::end(this_00);
  bVar1 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_false>
                      *)(local_40 + 0x18),
                     (_Node_iterator_base<std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_false>
                      *)(local_40 + 0x10));
  if (bVar1) {
    calc_coeffs((MonomialCoefficients *)local_40,n);
    pmVar2 = std::
             unordered_map<int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>_>
             ::operator[](this_00,(key_type *)(local_40 + 0x24));
    Eigen::Array<double,_-1,_1,_0,_-1,_1>::operator=
              (pmVar2,(Array<double,__1,_1,_0,__1,_1> *)local_40);
    Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array((Array<double,__1,_1,_0,__1,_1> *)local_40);
  }
  pmVar2 = std::
           unordered_map<int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>_>
           ::operator[](this_00,(key_type *)(local_40 + 0x24));
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::Array((Array<double,__1,_1,_0,__1,_1> *)this,pmVar2);
  mVar3.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  mVar3.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (mapped_type)mVar3.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

auto get_coeffs(int n){
            if (store.find(n) == store.end()){
                store[n] = calc_coeffs(n);
            }
            return store[n];
        }